

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BloomFilter.hpp
# Opt level: O2

string * __thiscall
supermap::BloomFilter<supermap::Key<10000ul>>::serialize_abi_cxx11_
          (string *__return_storage_ptr__,void *this,Key<10000UL> *value)

{
  stringstream stream;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  io::ShallowSerializer<supermap::Key<10000UL>_>::serialize(value,local_188);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string serialize(const T &value) const {
        std::stringstream stream;
        io::serialize(value, stream);
        return stream.str();
    }